

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asn1write.c
# Opt level: O1

int mbedtls_asn1_write_bool(uchar **p,uchar *start,int boolean)

{
  uchar *puVar1;
  int iVar2;
  int iVar3;
  
  puVar1 = *p;
  if (puVar1 == start || (long)puVar1 - (long)start < 0) {
    iVar2 = -0x6c;
  }
  else {
    *p = puVar1 + -1;
    puVar1[-1] = -(boolean != 0);
    puVar1 = *p;
    if ((long)puVar1 - (long)start < 1) {
      iVar2 = -0x6c;
    }
    else {
      *p = puVar1 + -1;
      puVar1[-1] = '\x01';
      iVar2 = 1;
    }
    if (puVar1 != start && -1 < (long)puVar1 - (long)start) {
      puVar1 = *p;
      if ((long)puVar1 - (long)start < 1) {
        iVar3 = -0x6c;
      }
      else {
        *p = puVar1 + -1;
        puVar1[-1] = '\x01';
        iVar3 = 1;
      }
      if (puVar1 != start && -1 < (long)puVar1 - (long)start) {
        return iVar2 + iVar3 + 1;
      }
      return iVar3;
    }
  }
  return iVar2;
}

Assistant:

int mbedtls_asn1_write_bool( unsigned char **p, unsigned char *start, int boolean )
{
    int ret;
    size_t len = 0;

    if( *p - start < 1 )
        return( MBEDTLS_ERR_ASN1_BUF_TOO_SMALL );

    *--(*p) = (boolean) ? 255 : 0;
    len++;

    MBEDTLS_ASN1_CHK_ADD( len, mbedtls_asn1_write_len( p, start, len ) );
    MBEDTLS_ASN1_CHK_ADD( len, mbedtls_asn1_write_tag( p, start, MBEDTLS_ASN1_BOOLEAN ) );

    return( (int) len );
}